

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-desc.c
# Opt level: O3

void plural_aux(char *name,size_t max)

{
  size_t sVar1;
  char *src;
  
  sVar1 = strlen(name);
  if (sVar1 != 0) {
    src = "s";
    if (name[sVar1 - 1] == 's') {
      src = "es";
    }
    my_strcat(name,src,max);
    return;
  }
  __assert_fail("name_len != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-desc.c"
                ,0x1e,"void plural_aux(char *, size_t)");
}

Assistant:

void plural_aux(char *name, size_t max)
{
	size_t name_len = strlen(name);
	assert(name_len != 0);

	if (name[name_len - 1] == 's')
		my_strcat(name, "es", max);
	else
		my_strcat(name, "s", max);
}